

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall QAbstractScrollAreaPrivate::flashScrollBars(QAbstractScrollAreaPrivate *this)

{
  long lVar1;
  int iVar2;
  QStyle *pQVar3;
  long in_RDI;
  long in_FS_OFFSET;
  bool vtransient;
  bool htransient;
  QStyleOptionSlider opt;
  QWidget *in_stack_ffffffffffffff58;
  QScrollBarPrivate *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&stack0xffffffffffffff78,&DAT_00ab23b0,0x80);
  QStyleOptionSlider::QStyleOptionSlider((QStyleOptionSlider *)0x49937b);
  (**(code **)(**(long **)(in_RDI + 0x288) + 0x1a8))
            (*(long **)(in_RDI + 0x288),&stack0xffffffffffffff78);
  pQVar3 = QWidget::style(in_stack_ffffffffffffff58);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))
                    (pQVar3,0x60,&stack0xffffffffffffff78,*(undefined8 *)(in_RDI + 0x288),0);
  if ((*(int *)(in_RDI + 0x29c) != 1) && ((*(int *)(in_RDI + 0x29c) == 0 || (iVar2 != 0)))) {
    QScrollBar::d_func((QScrollBar *)0x49940e);
    QScrollBarPrivate::flash(in_stack_ffffffffffffff78);
  }
  (**(code **)(**(long **)(in_RDI + 0x290) + 0x1a8))
            (*(long **)(in_RDI + 0x290),&stack0xffffffffffffff78);
  pQVar3 = QWidget::style(in_stack_ffffffffffffff58);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))
                    (pQVar3,0x60,&stack0xffffffffffffff78,*(undefined8 *)(in_RDI + 0x290),0);
  if ((*(int *)(in_RDI + 0x298) != 1) && ((*(int *)(in_RDI + 0x298) == 0 || (iVar2 != 0)))) {
    QScrollBar::d_func((QScrollBar *)0x4994a9);
    QScrollBarPrivate::flash(in_stack_ffffffffffffff78);
  }
  QStyleOptionSlider::~QStyleOptionSlider((QStyleOptionSlider *)0x4994bb);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractScrollAreaPrivate::flashScrollBars()
{
    QStyleOptionSlider opt;
    hbar->initStyleOption(&opt);

    bool htransient = hbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &opt, hbar);
    if ((hbarpolicy != Qt::ScrollBarAlwaysOff) && (hbarpolicy == Qt::ScrollBarAsNeeded || htransient))
        hbar->d_func()->flash();
    vbar->initStyleOption(&opt);
    bool vtransient = vbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &opt, vbar);
    if ((vbarpolicy != Qt::ScrollBarAlwaysOff) && (vbarpolicy == Qt::ScrollBarAsNeeded || vtransient))
        vbar->d_func()->flash();
}